

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O2

int Load_ARB_vertex_shader(void)

{
  _func_void_GLuint *p_Var1;
  _func_void_GLhandleARB_GLuint_GLsizei_GLsizei_ptr_GLint_ptr_GLenum_ptr_GLcharARB_ptr *p_Var2;
  _func_GLint_GLhandleARB_GLcharARB_ptr *p_Var3;
  _func_void_GLuint_GLenum_void_ptr_ptr *p_Var4;
  _func_void_GLuint_GLenum_GLdouble_ptr *p_Var5;
  _func_void_GLuint_GLenum_GLfloat_ptr *p_Var6;
  _func_void_GLuint_GLenum_GLint_ptr *p_Var7;
  _func_void_GLuint_GLdouble *p_Var8;
  _func_void_GLuint_GLdouble_ptr *p_Var9;
  _func_void_GLuint_GLfloat *p_Var10;
  _func_void_GLuint_GLfloat_ptr *p_Var11;
  _func_void_GLuint_GLshort *p_Var12;
  _func_void_GLuint_GLshort_ptr *p_Var13;
  _func_void_GLuint_GLdouble_GLdouble *p_Var14;
  _func_void_GLuint_GLdouble_ptr *p_Var15;
  _func_void_GLuint_GLfloat_GLfloat *p_Var16;
  _func_void_GLuint_GLfloat_ptr *p_Var17;
  _func_void_GLuint_GLshort_GLshort *p_Var18;
  _func_void_GLuint_GLshort_ptr *p_Var19;
  _func_void_GLuint_GLdouble_GLdouble_GLdouble *p_Var20;
  _func_void_GLuint_GLdouble_ptr *p_Var21;
  _func_void_GLuint_GLfloat_GLfloat_GLfloat *p_Var22;
  _func_void_GLuint_GLfloat_ptr *p_Var23;
  _func_void_GLuint_GLshort_GLshort_GLshort *p_Var24;
  _func_void_GLuint_GLshort_ptr *p_Var25;
  _func_void_GLuint_GLbyte_ptr *p_Var26;
  _func_void_GLuint_GLint_ptr *p_Var27;
  _func_void_GLuint_GLshort_ptr *p_Var28;
  _func_void_GLuint_GLubyte_GLubyte_GLubyte_GLubyte *p_Var29;
  _func_void_GLuint_GLubyte_ptr *p_Var30;
  _func_void_GLuint_GLuint_ptr *p_Var31;
  _func_void_GLuint_GLushort_ptr *p_Var32;
  _func_void_GLuint_GLbyte_ptr *p_Var33;
  _func_void_GLuint_GLdouble_GLdouble_GLdouble_GLdouble *p_Var34;
  _func_void_GLuint_GLdouble_ptr *p_Var35;
  _func_void_GLuint_GLfloat_GLfloat_GLfloat_GLfloat *p_Var36;
  _func_void_GLuint_GLfloat_ptr *p_Var37;
  _func_void_GLuint_GLint_ptr *p_Var38;
  _func_void_GLuint_GLshort_GLshort_GLshort_GLshort *p_Var39;
  _func_void_GLuint_GLshort_ptr *p_Var40;
  _func_void_GLuint_GLubyte_ptr *p_Var41;
  _func_void_GLuint_GLuint_ptr *p_Var42;
  _func_void_GLuint_GLushort_ptr *p_Var43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  
  sf_ptrc_glBindAttribLocationARB =
       (_func_void_GLhandleARB_GLuint_GLcharARB_ptr *)
       sf::Context::getFunction("glBindAttribLocationARB");
  bVar47 = sf_ptrc_glBindAttribLocationARB == (_func_void_GLhandleARB_GLuint_GLcharARB_ptr *)0x0;
  sf_ptrc_glDisableVertexAttribArrayARB =
       (_func_void_GLuint *)sf::Context::getFunction("glDisableVertexAttribArrayARB");
  uVar44 = bVar47 + 1;
  if (sf_ptrc_glDisableVertexAttribArrayARB != (_func_void_GLuint *)0x0) {
    uVar44 = (uint)bVar47;
  }
  uVar46 = uVar44;
  p_Var1 = (_func_void_GLuint *)sf::Context::getFunction("glEnableVertexAttribArrayARB");
  sf_ptrc_glEnableVertexAttribArrayARB = p_Var1;
  p_Var2 = (_func_void_GLhandleARB_GLuint_GLsizei_GLsizei_ptr_GLint_ptr_GLenum_ptr_GLcharARB_ptr *)
           sf::Context::getFunction("glGetActiveAttribARB");
  sf_ptrc_glGetActiveAttribARB = p_Var2;
  p_Var3 = (_func_GLint_GLhandleARB_GLcharARB_ptr *)
           sf::Context::getFunction("glGetAttribLocationARB");
  sf_ptrc_glGetAttribLocationARB = p_Var3;
  p_Var4 = (_func_void_GLuint_GLenum_void_ptr_ptr *)
           sf::Context::getFunction("glGetVertexAttribPointervARB");
  sf_ptrc_glGetVertexAttribPointervARB = p_Var4;
  p_Var5 = (_func_void_GLuint_GLenum_GLdouble_ptr *)
           sf::Context::getFunction("glGetVertexAttribdvARB");
  sf_ptrc_glGetVertexAttribdvARB = p_Var5;
  p_Var6 = (_func_void_GLuint_GLenum_GLfloat_ptr *)
           sf::Context::getFunction("glGetVertexAttribfvARB");
  sf_ptrc_glGetVertexAttribfvARB = p_Var6;
  p_Var7 = (_func_void_GLuint_GLenum_GLint_ptr *)sf::Context::getFunction("glGetVertexAttribivARB");
  sf_ptrc_glGetVertexAttribivARB = p_Var7;
  p_Var8 = (_func_void_GLuint_GLdouble *)sf::Context::getFunction("glVertexAttrib1dARB");
  sf_ptrc_glVertexAttrib1dARB = p_Var8;
  p_Var9 = (_func_void_GLuint_GLdouble_ptr *)sf::Context::getFunction("glVertexAttrib1dvARB");
  sf_ptrc_glVertexAttrib1dvARB = p_Var9;
  p_Var10 = (_func_void_GLuint_GLfloat *)sf::Context::getFunction("glVertexAttrib1fARB");
  sf_ptrc_glVertexAttrib1fARB = p_Var10;
  p_Var11 = (_func_void_GLuint_GLfloat_ptr *)sf::Context::getFunction("glVertexAttrib1fvARB");
  sf_ptrc_glVertexAttrib1fvARB = p_Var11;
  p_Var12 = (_func_void_GLuint_GLshort *)sf::Context::getFunction("glVertexAttrib1sARB");
  sf_ptrc_glVertexAttrib1sARB = p_Var12;
  p_Var13 = (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib1svARB");
  sf_ptrc_glVertexAttrib1svARB = p_Var13;
  p_Var14 = (_func_void_GLuint_GLdouble_GLdouble *)sf::Context::getFunction("glVertexAttrib2dARB");
  sf_ptrc_glVertexAttrib2dARB = p_Var14;
  p_Var15 = (_func_void_GLuint_GLdouble_ptr *)sf::Context::getFunction("glVertexAttrib2dvARB");
  sf_ptrc_glVertexAttrib2dvARB = p_Var15;
  p_Var16 = (_func_void_GLuint_GLfloat_GLfloat *)sf::Context::getFunction("glVertexAttrib2fARB");
  sf_ptrc_glVertexAttrib2fARB = p_Var16;
  p_Var17 = (_func_void_GLuint_GLfloat_ptr *)sf::Context::getFunction("glVertexAttrib2fvARB");
  sf_ptrc_glVertexAttrib2fvARB = p_Var17;
  p_Var18 = (_func_void_GLuint_GLshort_GLshort *)sf::Context::getFunction("glVertexAttrib2sARB");
  sf_ptrc_glVertexAttrib2sARB = p_Var18;
  p_Var19 = (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib2svARB");
  sf_ptrc_glVertexAttrib2svARB = p_Var19;
  p_Var20 = (_func_void_GLuint_GLdouble_GLdouble_GLdouble *)
            sf::Context::getFunction("glVertexAttrib3dARB");
  sf_ptrc_glVertexAttrib3dARB = p_Var20;
  p_Var21 = (_func_void_GLuint_GLdouble_ptr *)sf::Context::getFunction("glVertexAttrib3dvARB");
  sf_ptrc_glVertexAttrib3dvARB = p_Var21;
  p_Var22 = (_func_void_GLuint_GLfloat_GLfloat_GLfloat *)
            sf::Context::getFunction("glVertexAttrib3fARB");
  sf_ptrc_glVertexAttrib3fARB = p_Var22;
  p_Var23 = (_func_void_GLuint_GLfloat_ptr *)sf::Context::getFunction("glVertexAttrib3fvARB");
  sf_ptrc_glVertexAttrib3fvARB = p_Var23;
  p_Var24 = (_func_void_GLuint_GLshort_GLshort_GLshort *)
            sf::Context::getFunction("glVertexAttrib3sARB");
  sf_ptrc_glVertexAttrib3sARB = p_Var24;
  p_Var25 = (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib3svARB");
  sf_ptrc_glVertexAttrib3svARB = p_Var25;
  p_Var26 = (_func_void_GLuint_GLbyte_ptr *)sf::Context::getFunction("glVertexAttrib4NbvARB");
  sf_ptrc_glVertexAttrib4NbvARB = p_Var26;
  p_Var27 = (_func_void_GLuint_GLint_ptr *)sf::Context::getFunction("glVertexAttrib4NivARB");
  sf_ptrc_glVertexAttrib4NivARB = p_Var27;
  p_Var28 = (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib4NsvARB");
  sf_ptrc_glVertexAttrib4NsvARB = p_Var28;
  p_Var29 = (_func_void_GLuint_GLubyte_GLubyte_GLubyte_GLubyte *)
            sf::Context::getFunction("glVertexAttrib4NubARB");
  sf_ptrc_glVertexAttrib4NubARB = p_Var29;
  p_Var30 = (_func_void_GLuint_GLubyte_ptr *)sf::Context::getFunction("glVertexAttrib4NubvARB");
  sf_ptrc_glVertexAttrib4NubvARB = p_Var30;
  p_Var31 = (_func_void_GLuint_GLuint_ptr *)sf::Context::getFunction("glVertexAttrib4NuivARB");
  sf_ptrc_glVertexAttrib4NuivARB = p_Var31;
  p_Var32 = (_func_void_GLuint_GLushort_ptr *)sf::Context::getFunction("glVertexAttrib4NusvARB");
  sf_ptrc_glVertexAttrib4NusvARB = p_Var32;
  p_Var33 = (_func_void_GLuint_GLbyte_ptr *)sf::Context::getFunction("glVertexAttrib4bvARB");
  sf_ptrc_glVertexAttrib4bvARB = p_Var33;
  p_Var34 = (_func_void_GLuint_GLdouble_GLdouble_GLdouble_GLdouble *)
            sf::Context::getFunction("glVertexAttrib4dARB");
  sf_ptrc_glVertexAttrib4dARB = p_Var34;
  p_Var35 = (_func_void_GLuint_GLdouble_ptr *)sf::Context::getFunction("glVertexAttrib4dvARB");
  sf_ptrc_glVertexAttrib4dvARB = p_Var35;
  p_Var36 = (_func_void_GLuint_GLfloat_GLfloat_GLfloat_GLfloat *)
            sf::Context::getFunction("glVertexAttrib4fARB");
  sf_ptrc_glVertexAttrib4fARB = p_Var36;
  p_Var37 = (_func_void_GLuint_GLfloat_ptr *)sf::Context::getFunction("glVertexAttrib4fvARB");
  sf_ptrc_glVertexAttrib4fvARB = p_Var37;
  p_Var38 = (_func_void_GLuint_GLint_ptr *)sf::Context::getFunction("glVertexAttrib4ivARB");
  sf_ptrc_glVertexAttrib4ivARB = p_Var38;
  p_Var39 = (_func_void_GLuint_GLshort_GLshort_GLshort_GLshort *)
            sf::Context::getFunction("glVertexAttrib4sARB");
  sf_ptrc_glVertexAttrib4sARB = p_Var39;
  p_Var40 = (_func_void_GLuint_GLshort_ptr *)sf::Context::getFunction("glVertexAttrib4svARB");
  sf_ptrc_glVertexAttrib4svARB = p_Var40;
  p_Var41 = (_func_void_GLuint_GLubyte_ptr *)sf::Context::getFunction("glVertexAttrib4ubvARB");
  sf_ptrc_glVertexAttrib4ubvARB = p_Var41;
  p_Var42 = (_func_void_GLuint_GLuint_ptr *)sf::Context::getFunction("glVertexAttrib4uivARB");
  sf_ptrc_glVertexAttrib4uivARB = p_Var42;
  p_Var43 = (_func_void_GLuint_GLushort_ptr *)sf::Context::getFunction("glVertexAttrib4usvARB");
  sf_ptrc_glVertexAttrib4usvARB = p_Var43;
  sf_ptrc_glVertexAttribPointerARB =
       (_func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_void_ptr *)
       sf::Context::getFunction("glVertexAttribPointerARB");
  local_188 = (int)p_Var1;
  iStack_184 = (int)((ulong)p_Var1 >> 0x20);
  iStack_180 = (int)p_Var2;
  iStack_17c = (int)((ulong)p_Var2 >> 0x20);
  auVar49._0_4_ = -(uint)(local_188 == 0);
  auVar49._4_4_ = -(uint)(iStack_184 == 0);
  auVar49._8_4_ = -(uint)(iStack_180 == 0);
  auVar49._12_4_ = -(uint)(iStack_17c == 0);
  auVar52._4_4_ = auVar49._0_4_;
  auVar52._0_4_ = auVar49._4_4_;
  auVar52._8_4_ = auVar49._12_4_;
  auVar52._12_4_ = auVar49._8_4_;
  local_178 = (int)p_Var3;
  iStack_174 = (int)((ulong)p_Var3 >> 0x20);
  iStack_170 = (int)p_Var4;
  iStack_16c = (int)((ulong)p_Var4 >> 0x20);
  auVar61._0_4_ = -(uint)(local_178 == 0);
  auVar61._4_4_ = -(uint)(iStack_174 == 0);
  auVar61._8_4_ = -(uint)(iStack_170 == 0);
  auVar61._12_4_ = -(uint)(iStack_16c == 0);
  auVar50._4_4_ = auVar61._0_4_;
  auVar50._0_4_ = auVar61._4_4_;
  auVar50._8_4_ = auVar61._12_4_;
  auVar50._12_4_ = auVar61._8_4_;
  auVar48 = packssdw(auVar52 & auVar49,auVar50 & auVar61);
  local_168 = (int)p_Var5;
  iStack_164 = (int)((ulong)p_Var5 >> 0x20);
  iStack_160 = (int)p_Var6;
  iStack_15c = (int)((ulong)p_Var6 >> 0x20);
  auVar62._0_4_ = -(uint)(local_168 == 0);
  auVar62._4_4_ = -(uint)(iStack_164 == 0);
  auVar62._8_4_ = -(uint)(iStack_160 == 0);
  auVar62._12_4_ = -(uint)(iStack_15c == 0);
  auVar51._4_4_ = auVar62._0_4_;
  auVar51._0_4_ = auVar62._4_4_;
  auVar51._8_4_ = auVar62._12_4_;
  auVar51._12_4_ = auVar62._8_4_;
  local_b8 = (int)p_Var7;
  iStack_b4 = (int)((ulong)p_Var7 >> 0x20);
  iStack_b0 = (int)p_Var8;
  iStack_ac = (int)((ulong)p_Var8 >> 0x20);
  auVar78._0_4_ = -(uint)(local_b8 == 0);
  auVar78._4_4_ = -(uint)(iStack_b4 == 0);
  auVar78._8_4_ = -(uint)(iStack_b0 == 0);
  auVar78._12_4_ = -(uint)(iStack_ac == 0);
  auVar63._4_4_ = auVar78._0_4_;
  auVar63._0_4_ = auVar78._4_4_;
  auVar63._8_4_ = auVar78._12_4_;
  auVar63._12_4_ = auVar78._8_4_;
  auVar52 = packssdw(auVar51 & auVar62,auVar63 & auVar78);
  auVar48 = packssdw(auVar48,auVar52);
  local_a8 = (int)p_Var9;
  iStack_a4 = (int)((ulong)p_Var9 >> 0x20);
  iStack_a0 = (int)p_Var10;
  iStack_9c = (int)((ulong)p_Var10 >> 0x20);
  auVar64._0_4_ = -(uint)(local_a8 == 0);
  auVar64._4_4_ = -(uint)(iStack_a4 == 0);
  auVar64._8_4_ = -(uint)(iStack_a0 == 0);
  auVar64._12_4_ = -(uint)(iStack_9c == 0);
  auVar53._4_4_ = auVar64._0_4_;
  auVar53._0_4_ = auVar64._4_4_;
  auVar53._8_4_ = auVar64._12_4_;
  auVar53._12_4_ = auVar64._8_4_;
  local_108 = (int)p_Var11;
  iStack_104 = (int)((ulong)p_Var11 >> 0x20);
  iStack_100 = (int)p_Var12;
  iStack_fc = (int)((ulong)p_Var12 >> 0x20);
  auVar79._0_4_ = -(uint)(local_108 == 0);
  auVar79._4_4_ = -(uint)(iStack_104 == 0);
  auVar79._8_4_ = -(uint)(iStack_100 == 0);
  auVar79._12_4_ = -(uint)(iStack_fc == 0);
  auVar65._4_4_ = auVar79._0_4_;
  auVar65._0_4_ = auVar79._4_4_;
  auVar65._8_4_ = auVar79._12_4_;
  auVar65._12_4_ = auVar79._8_4_;
  auVar52 = packssdw(auVar53 & auVar64,auVar65 & auVar79);
  local_e8 = (int)p_Var13;
  iStack_e4 = (int)((ulong)p_Var13 >> 0x20);
  iStack_e0 = (int)p_Var14;
  iStack_dc = (int)((ulong)p_Var14 >> 0x20);
  auVar80._0_4_ = -(uint)(local_e8 == 0);
  auVar80._4_4_ = -(uint)(iStack_e4 == 0);
  auVar80._8_4_ = -(uint)(iStack_e0 == 0);
  auVar80._12_4_ = -(uint)(iStack_dc == 0);
  auVar66._4_4_ = auVar80._0_4_;
  auVar66._0_4_ = auVar80._4_4_;
  auVar66._8_4_ = auVar80._12_4_;
  auVar66._12_4_ = auVar80._8_4_;
  local_148 = (int)p_Var15;
  iStack_144 = (int)((ulong)p_Var15 >> 0x20);
  iStack_140 = (int)p_Var16;
  iStack_13c = (int)((ulong)p_Var16 >> 0x20);
  auVar87._0_4_ = -(uint)(local_148 == 0);
  auVar87._4_4_ = -(uint)(iStack_144 == 0);
  auVar87._8_4_ = -(uint)(iStack_140 == 0);
  auVar87._12_4_ = -(uint)(iStack_13c == 0);
  auVar81._4_4_ = auVar87._0_4_;
  auVar81._0_4_ = auVar87._4_4_;
  auVar81._8_4_ = auVar87._12_4_;
  auVar81._12_4_ = auVar87._8_4_;
  auVar67 = packssdw(auVar66 & auVar80,auVar81 & auVar87);
  auVar52 = packssdw(auVar52,auVar67);
  auVar52 = packsswb(auVar48,auVar52);
  local_128 = (int)p_Var17;
  iStack_124 = (int)((ulong)p_Var17 >> 0x20);
  iStack_120 = (int)p_Var18;
  iStack_11c = (int)((ulong)p_Var18 >> 0x20);
  auVar54._0_4_ = -(uint)(local_128 == 0);
  auVar54._4_4_ = -(uint)(iStack_124 == 0);
  auVar54._8_4_ = -(uint)(iStack_120 == 0);
  auVar54._12_4_ = -(uint)(iStack_11c == 0);
  auVar67._4_4_ = auVar54._0_4_;
  auVar67._0_4_ = auVar54._4_4_;
  auVar67._8_4_ = auVar54._12_4_;
  auVar67._12_4_ = auVar54._8_4_;
  local_158 = (int)p_Var19;
  iStack_154 = (int)((ulong)p_Var19 >> 0x20);
  iStack_150 = (int)p_Var20;
  iStack_14c = (int)((ulong)p_Var20 >> 0x20);
  auVar68._0_4_ = -(uint)(local_158 == 0);
  auVar68._4_4_ = -(uint)(iStack_154 == 0);
  auVar68._8_4_ = -(uint)(iStack_150 == 0);
  auVar68._12_4_ = -(uint)(iStack_14c == 0);
  auVar55._4_4_ = auVar68._0_4_;
  auVar55._0_4_ = auVar68._4_4_;
  auVar55._8_4_ = auVar68._12_4_;
  auVar55._12_4_ = auVar68._8_4_;
  auVar48 = packssdw(auVar67 & auVar54,auVar55 & auVar68);
  local_138 = (int)p_Var21;
  iStack_134 = (int)((ulong)p_Var21 >> 0x20);
  iStack_130 = (int)p_Var22;
  iStack_12c = (int)((ulong)p_Var22 >> 0x20);
  auVar69._0_4_ = -(uint)(local_138 == 0);
  auVar69._4_4_ = -(uint)(iStack_134 == 0);
  auVar69._8_4_ = -(uint)(iStack_130 == 0);
  auVar69._12_4_ = -(uint)(iStack_12c == 0);
  auVar56._4_4_ = auVar69._0_4_;
  auVar56._0_4_ = auVar69._4_4_;
  auVar56._8_4_ = auVar69._12_4_;
  auVar56._12_4_ = auVar69._8_4_;
  local_118 = (int)p_Var23;
  iStack_114 = (int)((ulong)p_Var23 >> 0x20);
  iStack_110 = (int)p_Var24;
  iStack_10c = (int)((ulong)p_Var24 >> 0x20);
  auVar82._0_4_ = -(uint)(local_118 == 0);
  auVar82._4_4_ = -(uint)(iStack_114 == 0);
  auVar82._8_4_ = -(uint)(iStack_110 == 0);
  auVar82._12_4_ = -(uint)(iStack_10c == 0);
  auVar70._4_4_ = auVar82._0_4_;
  auVar70._0_4_ = auVar82._4_4_;
  auVar70._8_4_ = auVar82._12_4_;
  auVar70._12_4_ = auVar82._8_4_;
  auVar67 = packssdw(auVar56 & auVar69,auVar70 & auVar82);
  auVar48 = packssdw(auVar48,auVar67);
  local_f8 = (int)p_Var25;
  iStack_f4 = (int)((ulong)p_Var25 >> 0x20);
  iStack_f0 = (int)p_Var26;
  iStack_ec = (int)((ulong)p_Var26 >> 0x20);
  auVar71._0_4_ = -(uint)(local_f8 == 0);
  auVar71._4_4_ = -(uint)(iStack_f4 == 0);
  auVar71._8_4_ = -(uint)(iStack_f0 == 0);
  auVar71._12_4_ = -(uint)(iStack_ec == 0);
  auVar57._4_4_ = auVar71._0_4_;
  auVar57._0_4_ = auVar71._4_4_;
  auVar57._8_4_ = auVar71._12_4_;
  auVar57._12_4_ = auVar71._8_4_;
  local_d8 = (int)p_Var27;
  iStack_d4 = (int)((ulong)p_Var27 >> 0x20);
  iStack_d0 = (int)p_Var28;
  iStack_cc = (int)((ulong)p_Var28 >> 0x20);
  auVar83._0_4_ = -(uint)(local_d8 == 0);
  auVar83._4_4_ = -(uint)(iStack_d4 == 0);
  auVar83._8_4_ = -(uint)(iStack_d0 == 0);
  auVar83._12_4_ = -(uint)(iStack_cc == 0);
  auVar72._4_4_ = auVar83._0_4_;
  auVar72._0_4_ = auVar83._4_4_;
  auVar72._8_4_ = auVar83._12_4_;
  auVar72._12_4_ = auVar83._8_4_;
  auVar67 = packssdw(auVar57 & auVar71,auVar72 & auVar83);
  local_c8 = (int)p_Var29;
  iStack_c4 = (int)((ulong)p_Var29 >> 0x20);
  iStack_c0 = (int)p_Var30;
  iStack_bc = (int)((ulong)p_Var30 >> 0x20);
  auVar84._0_4_ = -(uint)(local_c8 == 0);
  auVar84._4_4_ = -(uint)(iStack_c4 == 0);
  auVar84._8_4_ = -(uint)(iStack_c0 == 0);
  auVar84._12_4_ = -(uint)(iStack_bc == 0);
  auVar73._4_4_ = auVar84._0_4_;
  auVar73._0_4_ = auVar84._4_4_;
  auVar73._8_4_ = auVar84._12_4_;
  auVar73._12_4_ = auVar84._8_4_;
  local_98 = (int)p_Var31;
  iStack_94 = (int)((ulong)p_Var31 >> 0x20);
  iStack_90 = (int)p_Var32;
  iStack_8c = (int)((ulong)p_Var32 >> 0x20);
  auVar88._0_4_ = -(uint)(local_98 == 0);
  auVar88._4_4_ = -(uint)(iStack_94 == 0);
  auVar88._8_4_ = -(uint)(iStack_90 == 0);
  auVar88._12_4_ = -(uint)(iStack_8c == 0);
  auVar85._4_4_ = auVar88._0_4_;
  auVar85._0_4_ = auVar88._4_4_;
  auVar85._8_4_ = auVar88._12_4_;
  auVar85._12_4_ = auVar88._8_4_;
  auVar74 = packssdw(auVar73 & auVar84,auVar85 & auVar88);
  auVar67 = packssdw(auVar67,auVar74);
  auVar67 = packsswb(auVar48,auVar67);
  local_198 = (int)p_Var33;
  iStack_194 = (int)((ulong)p_Var33 >> 0x20);
  iStack_190 = (int)p_Var34;
  iStack_18c = (int)((ulong)p_Var34 >> 0x20);
  auVar58._0_4_ = -(uint)(local_198 == 0);
  auVar58._4_4_ = -(uint)(iStack_194 == 0);
  auVar58._8_4_ = -(uint)(iStack_190 == 0);
  auVar58._12_4_ = -(uint)(iStack_18c == 0);
  auVar74._4_4_ = auVar58._0_4_;
  auVar74._0_4_ = auVar58._4_4_;
  auVar74._8_4_ = auVar58._12_4_;
  auVar74._12_4_ = auVar58._8_4_;
  local_88 = (int)p_Var35;
  iStack_84 = (int)((ulong)p_Var35 >> 0x20);
  iStack_80 = (int)p_Var36;
  iStack_7c = (int)((ulong)p_Var36 >> 0x20);
  auVar75._0_4_ = -(uint)(local_88 == 0);
  auVar75._4_4_ = -(uint)(iStack_84 == 0);
  auVar75._8_4_ = -(uint)(iStack_80 == 0);
  auVar75._12_4_ = -(uint)(iStack_7c == 0);
  auVar59._4_4_ = auVar75._0_4_;
  auVar59._0_4_ = auVar75._4_4_;
  auVar59._8_4_ = auVar75._12_4_;
  auVar59._12_4_ = auVar75._8_4_;
  auVar48 = packssdw(auVar74 & auVar58,auVar59 & auVar75);
  local_78 = (int)p_Var37;
  iStack_74 = (int)((ulong)p_Var37 >> 0x20);
  iStack_70 = (int)p_Var38;
  iStack_6c = (int)((ulong)p_Var38 >> 0x20);
  auVar76._0_4_ = -(uint)(local_78 == 0);
  auVar76._4_4_ = -(uint)(iStack_74 == 0);
  auVar76._8_4_ = -(uint)(iStack_70 == 0);
  auVar76._12_4_ = -(uint)(iStack_6c == 0);
  auVar60._4_4_ = auVar76._0_4_;
  auVar60._0_4_ = auVar76._4_4_;
  auVar60._8_4_ = auVar76._12_4_;
  auVar60._12_4_ = auVar76._8_4_;
  local_68 = (int)p_Var39;
  iStack_64 = (int)((ulong)p_Var39 >> 0x20);
  iStack_60 = (int)p_Var40;
  iStack_5c = (int)((ulong)p_Var40 >> 0x20);
  auVar86._0_4_ = -(uint)(local_68 == 0);
  auVar86._4_4_ = -(uint)(iStack_64 == 0);
  auVar86._8_4_ = -(uint)(iStack_60 == 0);
  auVar86._12_4_ = -(uint)(iStack_5c == 0);
  auVar77._4_4_ = auVar86._0_4_;
  auVar77._0_4_ = auVar86._4_4_;
  auVar77._8_4_ = auVar86._12_4_;
  auVar77._12_4_ = auVar86._8_4_;
  auVar74 = packssdw(auVar60 & auVar76,auVar77 & auVar86);
  auVar48 = packssdw(auVar48,auVar74);
  auVar74 = packsswb(auVar48,auVar48);
  auVar48._0_4_ = -(uint)((int)((ulong)p_Var41 >> 0x20) == 0 && (int)p_Var41 == 0);
  auVar48._4_4_ = -(uint)((int)p_Var42 == 0 && (int)((ulong)p_Var42 >> 0x20) == 0);
  auVar48._8_4_ = -(uint)((int)((ulong)p_Var43 >> 0x20) == 0 && (int)p_Var43 == 0);
  auVar48._12_4_ =
       -(uint)((int)sf_ptrc_glVertexAttribPointerARB == 0 &&
              (int)((ulong)sf_ptrc_glVertexAttribPointerARB >> 0x20) == 0);
  iVar45 = movmskps(uVar46,auVar48);
  uVar46 = CONCAT22((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar67[0xf] >> 7) << 0xf,
                    (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar52[0xf] >> 7) << 0xf);
  uVar46 = uVar46 - (uVar46 >> 1 & 0x55555555);
  uVar46 = (uVar46 >> 2 & 0x33333333) + (uVar46 & 0x33333333);
  return ((uint)(0x4332322132212110 >> ((byte)(iVar45 << 2) & 0x3f)) & 7) +
         (((uint)(byte)(SUB161(auVar74 >> 7,0) & 1 | (SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                        (SUB161(auVar74 >> 0x17,0) & 1) << 2 | (SUB161(auVar74 >> 0x1f,0) & 1) << 3
                        | (SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                        (SUB161(auVar74 >> 0x2f,0) & 1) << 5 | (SUB161(auVar74 >> 0x37,0) & 1) << 6
                       | SUB161(auVar74 >> 0x3f,0) << 7) * 0x8040201 >> 3 & 0x11111111) * 0x11111111
         >> 0x1c) + uVar44 + (((uVar46 >> 4) + uVar46 & 0xf0f0f0f) * 0x1010101 >> 0x18);
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}